

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O0

void __thiscall Mempool::mem_init(Mempool *this,MEM_CAP size,int chunk_num)

{
  Chunk *pCVar1;
  mapped_type *ppCVar2;
  Chunk *local_50;
  int local_44;
  MEM_CAP local_40;
  int i;
  MEM_CAP local_38 [5];
  undefined1 local_21;
  mapped_type local_20;
  Chunk *prev;
  int chunk_num_local;
  MEM_CAP size_local;
  Mempool *this_local;
  
  prev._0_4_ = chunk_num;
  prev._4_4_ = size;
  _chunk_num_local = this;
  pCVar1 = (Chunk *)operator_new(0x20,(nothrow_t *)&std::nothrow);
  local_21 = 0;
  local_50 = (Chunk *)0x0;
  if (pCVar1 != (Chunk *)0x0) {
    local_21 = 1;
    Chunk::Chunk(pCVar1,prev._4_4_);
    local_50 = pCVar1;
  }
  local_38[0] = prev._4_4_;
  ppCVar2 = std::
            unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
            ::operator[](&this->mp_pool,(key_type *)local_38);
  *ppCVar2 = local_50;
  i = prev._4_4_;
  ppCVar2 = std::
            unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
            ::operator[](&this->mp_pool,&i);
  if (*ppCVar2 == (mapped_type)0x0) {
    if (-1 < pr_level) {
      printf("[%-5s][%s:%d] new chunk %d error","error","mem_init",0xb,(ulong)prev._4_4_);
    }
    exit(1);
  }
  local_40 = prev._4_4_;
  ppCVar2 = std::
            unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
            ::operator[](&this->mp_pool,(key_type *)&local_40);
  local_20 = *ppCVar2;
  local_44 = 1;
  while( true ) {
    if ((int)prev <= local_44) {
      this->mp_total_size_kb =
           (long)(((int)prev._4_4_ / 0x400) * (int)prev) + this->mp_total_size_kb;
      return;
    }
    pCVar1 = (Chunk *)operator_new(0x20);
    Chunk::Chunk(pCVar1,prev._4_4_);
    local_20->next = pCVar1;
    if (local_20->next == (Chunk *)0x0) break;
    local_20 = local_20->next;
    local_44 = local_44 + 1;
  }
  if (-1 < pr_level) {
    printf("[%-5s][%s:%d] new chunk m4K error","error","mem_init",0x13);
  }
  exit(1);
}

Assistant:

void Mempool::mem_init(MEM_CAP size, int chunk_num)
{
    Chunk *prev; 
    mp_pool[size] = new (std::nothrow) Chunk(size);
    if (mp_pool[size] == nullptr) {
        PR_ERROR("new chunk %d error", static_cast<int>(size));
        exit(1);
    }
    prev = mp_pool[size];

    for (int i = 1; i < chunk_num; i ++) {
        prev->next = new Chunk(size);
        if (prev->next == nullptr) {
            PR_ERROR("new chunk m4K error");
            exit(1);
        }
        prev = prev->next;
    }
    mp_total_size_kb += size/1024 * chunk_num;
}